

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  AlphaNum local_100;
  AlphaNum local_d0;
  AlphaNum local_a0;
  AlphaNum local_70;
  AlphaNum local_40;
  
  local_d0.piece_ = NullSafeStringView("\"");
  local_a0.piece_._M_len = **(size_t **)this;
  local_a0.piece_._M_str = (char *)(*(size_t **)this)[1];
  local_100.piece_ =
       NullSafeStringView("\" is already defined (as something other than a package) in file \"");
  if (**(long **)(this + 8) == 0) {
    local_40.piece_._M_len = 4;
    local_40.piece_._M_str = "null";
  }
  else {
    puVar1 = *(undefined8 **)(**(long **)(this + 8) + 8);
    local_40.piece_._M_str = (char *)*puVar1;
    local_40.piece_._M_len = puVar1[1];
  }
  local_70.piece_ = NullSafeStringView("\".");
  StrCat<>(__return_storage_ptr__,&local_d0,&local_a0,&local_100,&local_40,&local_70);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}